

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::
     PostWalker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
     scan(TestStringifyWalker *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  Binary *pBVar5;
  ContBind *pCVar6;
  RefI31 *pRVar7;
  TableGet *pTVar8;
  CallRef *pCVar9;
  LocalSet *pLVar10;
  Call *pCVar11;
  ArrayInitData *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Switch *pSVar16;
  ArrayNew *pAVar17;
  Return *pRVar18;
  StructNew *pSVar19;
  BrOn *pBVar20;
  Suspend *pSVar21;
  Store *pSVar22;
  Throw *pTVar23;
  ArrayFill *pAVar24;
  ResumeThrow *pRVar25;
  TupleMake *pTVar26;
  StringNew *pSVar27;
  ArrayNewFixed *pAVar28;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Binary *currp_03;
  Expression **currp_04;
  Expression **currp_05;
  ulong uVar29;
  Break *pBVar30;
  StringConcat *currp_06;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)*(uint *)(pBVar1 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pBVar1 + 0x20),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitIf,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::If>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    maybePushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                   *)self,(TaskFunc)((If *)pAVar24 + 0x20),currp_02);
    goto LAB_001cff26;
  case LoopId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLoop,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::Loop>(this);
    goto LAB_001cfaff;
  case BreakId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBreak,currp);
    pBVar30 = Expression::cast<wasm::Break>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    maybePushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                   *)self,(TaskFunc)(pBVar30 + 0x28),currp_01);
    pBVar30 = pBVar30 + 0x20;
    ppEVar4 = extraout_RDX;
    goto LAB_001cf9f9;
  case SwitchId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSwitch,currp);
    pSVar16 = Expression::cast<wasm::Switch>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pSVar16 + 0x48));
    pBVar30 = (Break *)(pSVar16 + 0x40);
    ppEVar4 = extraout_RDX_00;
    goto LAB_001cf9f9;
  case CallId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)*(uint *)(pCVar11 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar11 + 0x10),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pCVar13 + 0x38));
    uVar29 = (ulong)*(uint *)(pCVar13 + 0x20);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar13 + 0x18),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLocalSet,currp);
    pLVar10 = Expression::cast<wasm::LocalSet>(this);
    goto LAB_001cfd57;
  case GlobalGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitGlobalSet,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::GlobalSet>(this);
    goto LAB_001cfaff;
  case LoadId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    currp_06 = (StringConcat *)(pLVar14 + 0x30);
    goto LAB_001cff3e;
  case StoreId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_001cfd1e;
  case ConstId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitUnary,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::Unary>(this);
    goto LAB_001cfd57;
  case BinaryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBinary,currp);
    pBVar5 = Expression::cast<wasm::Binary>(this);
    goto LAB_001cfcc0;
  case SelectId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSelect,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::Select>(this);
    goto LAB_001cff17;
  case DropId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitDrop,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::Drop>(this);
    goto LAB_001cfb90;
  case ReturnId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitReturn,currp);
    pRVar18 = Expression::cast<wasm::Return>(this);
    pBVar30 = (Break *)&pRVar18->value;
    ppEVar4 = extraout_RDX_02;
    goto LAB_001cf9f9;
  case MemorySizeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryGrow,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_001cfb90;
  case NopId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicRMW,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_001cfd9e;
  case AtomicCmpxchgId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicCmpxchg,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_001cfd8f;
  case AtomicWaitId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicWait,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_001cfb1f;
  case AtomicNotifyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicNotify,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_001cfcc0;
  case AtomicFenceId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDExtract,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_001cfd57;
  case SIMDReplaceId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDReplace,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::SIMDReplace>(this);
    currp_03 = pBVar5 + 1;
    goto LAB_001cfcce;
  case SIMDShuffleId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDShuffle,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_001cff26;
  case SIMDTernaryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDTernary,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_001cfb1f;
  case SIMDShiftId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDShift,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_001cfcc0;
  case SIMDLoadId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDLoad,currp);
    pBVar20 = (BrOn *)Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_001cfc5a;
  case SIMDLoadStoreLaneId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_001cfd1e:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pSVar22 + 0x38));
    currp_06 = (StringConcat *)(pSVar22 + 0x30);
    goto LAB_001cff3e;
  case MemoryInitId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryInit,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_001cfd8f;
  case DataDropId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryCopy,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_001cff17;
  case MemoryFillId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitMemoryFill,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_001cff17;
  case PopId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefIsNull,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_001cfb90;
  case RefFuncId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefEq,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::RefEq>(this);
    goto LAB_001cff26;
  case TableGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableGet,currp);
    pTVar8 = Expression::cast<wasm::TableGet>(this);
LAB_001cfaff:
    currp_06 = (StringConcat *)(pTVar8 + 0x20);
    goto LAB_001cff3e;
  case TableSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableSet,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableSet>(this);
    goto LAB_001cfd9e;
  case TableSizeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableGrow,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_001cfd9e;
  case TableFillId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableFill,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableFill>(this);
    goto LAB_001cfd8f;
  case TableCopyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableCopy,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_001cff17;
  case TableInitId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTableInit,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableInit>(this);
    goto LAB_001cfd8f;
  case TryId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    currp_06 = (StringConcat *)&pTVar15->body;
    goto LAB_001cff3e;
  case TryTableId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTryTable,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TryTable>(this);
    goto LAB_001cfb90;
  case ThrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)*(uint *)(pTVar23 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar23 + 0x20),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitThrowRef,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_001cfb90;
  case TupleMakeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTupleMake,currp);
    pTVar26 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)*(uint *)(pTVar26 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar26 + 0x10),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitTupleExtract,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_001cfb90;
  case RefI31Id:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefI31,currp);
    pRVar7 = Expression::cast<wasm::RefI31>(this);
    goto LAB_001cfb90;
  case I31GetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitI31Get,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::I31Get>(this);
    goto LAB_001cfb90;
  case CallRefId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pCVar9 + 0x30));
    uVar29 = (ulong)*(uint *)(pCVar9 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar9 + 0x10),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefTest,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefTest>(this);
    goto LAB_001cfb90;
  case RefCastId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefCast,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefCast>(this);
    goto LAB_001cfb90;
  case BrOnId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitBrOn,currp);
    pBVar20 = Expression::cast<wasm::BrOn>(this);
LAB_001cfc5a:
    currp_06 = (StringConcat *)(pBVar20 + 0x28);
    goto LAB_001cff3e;
  case StructNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructNew,currp);
    pSVar19 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)*(uint *)(pSVar19 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar19 + 0x10),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructGet,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::StructGet>(this);
    goto LAB_001cfd57;
  case StructSetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructSet,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StructSet>(this);
    goto LAB_001cfcc0;
  case StructRMWId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructRMW,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_001cfcc0;
  case StructCmpxchgId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStructCmpxchg,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_001cfb1f:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pBVar5 + 1));
    currp_03 = (Binary *)&pBVar5->right;
    goto LAB_001cfcce;
  case ArrayNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNew,currp);
    pAVar17 = Expression::cast<wasm::ArrayNew>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pAVar17 + 0x18));
    pBVar30 = (Break *)(pAVar17 + 0x10);
    ppEVar4 = extraout_RDX_01;
LAB_001cf9f9:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    maybePushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                   *)self,(TaskFunc)pBVar30,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNewData,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_001cfd9e;
  case ArrayNewElemId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNewElem,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_001cfd9e;
  case ArrayNewFixedId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayNewFixed,currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)*(uint *)(pAVar28 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pAVar28 + 0x10),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayGet,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_001cff26;
  case ArraySetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArraySet,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_001cff17;
  case ArrayLenId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayLen,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_001cfb90;
  case ArrayCopyId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayCopy,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,
             (Expression **)((ArrayCopy *)pAVar24 + 0x30));
    goto LAB_001cff08;
  case ArrayFillId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayFill,currp);
    pAVar24 = Expression::cast<wasm::ArrayFill>(this);
LAB_001cff08:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,
             (Expression **)((StringConcat *)pAVar24 + 0x28));
    goto LAB_001cff17;
  case ArrayInitDataId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayInitData,currp);
    pAVar12 = Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_001cf68f;
  case ArrayInitElemId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitArrayInitElem,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_001cf68f:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pAVar12 + 0x38));
LAB_001cfd8f:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pAVar12 + 0x30));
LAB_001cfd9e:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pAVar12 + 0x28));
    currp_06 = (StringConcat *)(pAVar12 + 0x20);
    goto LAB_001cff3e;
  case RefAsId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitRefAs,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_001cfd57;
  case StringNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringNew,currp);
    pSVar27 = Expression::cast<wasm::StringNew>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    maybePushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                   *)self,(TaskFunc)(pSVar27 + 0x28),currp_04);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    maybePushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                   *)self,(TaskFunc)(pSVar27 + 0x20),currp_05);
    currp_06 = (StringConcat *)(pSVar27 + 0x18);
    goto LAB_001cff3e;
  case StringConstId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringMeasure,currp);
    pLVar10 = (LocalSet *)Expression::cast<wasm::StringMeasure>(this);
LAB_001cfd57:
    currp_06 = (StringConcat *)&pLVar10->value;
    goto LAB_001cff3e;
  case StringEncodeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringEncode,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StringEncode>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    maybePushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                   *)self,(TaskFunc)(pBVar5 + 1),currp_00);
    currp_03 = (Binary *)&pBVar5->right;
    goto LAB_001cfcce;
  case StringConcatId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringConcat,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_001cff26;
  case StringEqId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringEq,currp);
    pBVar5 = (Binary *)Expression::cast<wasm::StringEq>(this);
LAB_001cfcc0:
    currp_03 = (Binary *)&pBVar5->right;
LAB_001cfcce:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)currp_03);
    currp_06 = (StringConcat *)&pBVar5->left;
    goto LAB_001cff3e;
  case StringWTF16GetId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringWTF16Get,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_001cff26;
  case StringSliceWTFId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStringSliceWTF,currp);
    pAVar24 = (ArrayFill *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_001cff17:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,
             (Expression **)((StringConcat *)pAVar24 + 0x20));
LAB_001cff26:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,
             (Expression **)((StringConcat *)pAVar24 + 0x18));
    currp_06 = (StringConcat *)pAVar24 + 0x10;
    goto LAB_001cff3e;
  case ContNewId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitContNew,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ContNew>(this);
LAB_001cfb90:
    currp_06 = (StringConcat *)(pRVar7 + 0x10);
LAB_001cff3e:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)currp_06);
    return;
  case ContBindId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pCVar6 + 0x30));
    uVar29 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitSuspend,currp);
    pSVar21 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)*(uint *)(pSVar21 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar21 + 0x20),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pRVar2 + 0x70));
    uVar29 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitResumeThrow,currp);
    pRVar25 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pRVar25 + 0x80));
    uVar29 = (ulong)*(uint *)(pRVar25 + 0x68);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar25 + 0x60),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                     ::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
    pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
              *)self,StringifyWalker<TestStringifyWalker>::scan,(Expression **)(pSVar3 + 0x40));
    uVar29 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar29);
      Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>::
      pushTask((Walker<TestStringifyWalker,_wasm::UnifiedExpressionVisitor<TestStringifyWalker,_void>_>
                *)self,StringifyWalker<TestStringifyWalker>::scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }